

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O3

void __thiscall
solitaire::SolitaireEmptyHandTest_tryPullOutNoCardsFromTableauPile_Test::TestBody
          (SolitaireEmptyHandTest_tryPullOutNoCardsFromTableauPile_Test *this)

{
  FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  *this_00;
  TableauPileMock *pTVar1;
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  *this_01;
  Cards *pCVar2;
  Solitaire *this_02;
  char *in_R9;
  AssertHelper local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  undefined1 local_90 [16];
  _Manager_type local_80;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  MatcherBase<unsigned_int> local_50;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_38;
  PileId local_1c;
  
  pTVar1 = (this->super_SolitaireEmptyHandTest).super_SolitaireTest.lastTableauPileMock;
  this_00 = &pTVar1->gmock00_createSnapshot_13;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,pTVar1);
  local_70._0_8_ = this_00;
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::InternalExpectedAt
            ((MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
              *)local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x12d,"lastTableauPileMock","createSnapshot()");
  pTVar1 = (this->super_SolitaireEmptyHandTest).super_SolitaireTest.lastTableauPileMock;
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_50,2);
  piles::TableauPileMock::gmock_tryPullOutCards
            ((MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
              *)local_70,pTVar1,(Matcher<unsigned_int> *)&local_50);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
            ::InternalExpectedAt
                      ((MockSpec<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
                        *)local_70,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x12e,"lastTableauPileMock","tryPullOutCards(quantityToPullOut)");
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_38,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (anonymous_namespace)::noCards);
  testing::Return<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            ((testing *)&local_a0,&local_38);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
              *)local_90,(ReturnAction *)&local_a0);
  testing::internal::
  TypedExpectation<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::WillOnce(this_01,(Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
                      *)local_90);
  if (local_80 != (_Manager_type)0x0) {
    (*local_80)((_Any_data *)local_90,(_Any_data *)local_90,__destroy_functor);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (local_38.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)(local_70 + 8));
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase(&local_50);
  this_02 = &(this->super_SolitaireEmptyHandTest).super_SolitaireTest.solitaire;
  local_1c.t = (anonymous_namespace)::lastTableauPileId;
  Solitaire::tryPullOutCardsFromTableauPile(this_02,&local_1c,2);
  pCVar2 = Solitaire::getCardsInHand(this_02);
  local_90[0] = (pCVar2->
                super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)
                ._M_impl.super__Vector_impl_data._M_start ==
                (pCVar2->
                super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
  local_90._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_90[0]) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)local_90,
               (AssertionResult *)"solitaire.getCardsInHand().empty()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x132,(char *)local_70._0_8_);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._0_8_ != &local_60) {
      operator_delete((void *)local_70._0_8_,(ulong)(local_60._M_allocated_capacity + 1));
    }
    if (local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
        (_func_int **)0x0) {
      (**(code **)(*local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))()
      ;
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
  }
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, tryPullOutNoCardsFromTableauPile) {
    EXPECT_CALL(lastTableauPileMock, createSnapshot());
    EXPECT_CALL(lastTableauPileMock, tryPullOutCards(quantityToPullOut))
        .WillOnce(Return(noCards));

    solitaire.tryPullOutCardsFromTableauPile(lastTableauPileId, quantityToPullOut);
    EXPECT_TRUE(solitaire.getCardsInHand().empty());
}